

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

int fmt::v11::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  uint max;
  int digits10;
  long num_digits;
  char *p;
  uint prev;
  uint value;
  uint local_48;
  bool local_41;
  char *local_30;
  uint local_24;
  bool local_1d;
  uint local_1c;
  char *local_18;
  long *local_10;
  uint local_4;
  
  local_41 = false;
  if (((char *)*in_RDI != in_RSI) && (local_41 = false, '/' < *(char *)*in_RDI)) {
    local_41 = *(char *)*in_RDI < ':';
  }
  local_1d = local_41;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  ignore_unused<bool,char[1]>(&local_1d,(char (*) [1])0x833d3c);
  local_24 = 0;
  pcVar4 = (char *)*local_10;
  uVar3 = local_24;
  do {
    local_24 = uVar3;
    local_30 = pcVar4;
    local_48 = local_24 * 10 + *local_30 + -0x30;
    pcVar4 = local_30 + 1;
    bVar2 = false;
    if ((pcVar4 != local_18) && (bVar2 = false, '/' < *pcVar4)) {
      bVar2 = *pcVar4 < ':';
    }
    uVar3 = local_48;
  } while (bVar2);
  lVar1 = *local_10;
  *local_10 = (long)pcVar4;
  local_4 = local_48;
  if (9 < (long)pcVar4 - lVar1) {
    if (((long)pcVar4 - lVar1 != 10) ||
       (0x7fffffff < (ulong)local_24 * 10 + (ulong)((int)*local_30 - 0x30))) {
      local_48 = local_1c;
    }
    local_4 = local_48;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  int digits10 = static_cast<int>(sizeof(int) * CHAR_BIT * 3 / 10);
  if (num_digits <= digits10) return static_cast<int>(value);
  // Check for overflow.
  unsigned max = INT_MAX;
  return num_digits == digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}